

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O3

void fe::operations::
     applyOperationT<fe::operations::op_blend_one_invSrcAlpha,fe::PixelDISTANCE,fe::PixelB8G8R8A8>
               (op_blend_one_invSrcAlpha *op,PixelDISTANCE *srcPixelFormat,
               PixelB8G8R8A8 *destPixelFormat,ImageData *src,ImageData *dest)

{
  float fVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  bool bVar7;
  byte *pbVar8;
  byte bVar9;
  uint uVar10;
  float *pfVar11;
  int iVar12;
  byte *pbVar13;
  byte bVar14;
  uint uVar15;
  byte bVar16;
  float *pfVar17;
  
  bVar7 = check(src,dest);
  if ((bVar7) && (iVar2 = (dest->super_fe_image).h, iVar2 != 0)) {
    iVar3 = (dest->super_fe_image).w;
    pbVar13 = (dest->super_fe_image).data;
    pfVar17 = (float *)(src->super_fe_image).data;
    iVar12 = 0;
    iVar6 = iVar3;
    pfVar11 = pfVar17;
    pbVar8 = pbVar13;
    do {
      for (; iVar6 != 0; iVar6 = iVar6 + -1) {
        fVar1 = *pfVar17;
        uVar10 = (uint)((fVar1 - pfVar17[1]) * 10.0);
        uVar15 = -uVar10;
        if (0 < (int)uVar10) {
          uVar15 = uVar10;
        }
        bVar14 = (byte)uVar15;
        if (0xfe < uVar15) {
          bVar14 = 0xff;
        }
        bVar7 = NAN(fVar1);
        bVar4 = fVar1 != 0.0;
        bVar9 = ~bVar14;
        bVar5 = 0;
        if (fVar1 < 0.0) {
          bVar9 = 0;
          bVar5 = ~bVar14;
        }
        bVar16 = (byte)(int)(255.0 - pfVar17[1] * 255.0);
        bVar14 = bVar16;
        if (bVar4) {
          bVar14 = bVar9;
        }
        if (bVar7) {
          bVar14 = bVar9;
        }
        bVar9 = bVar16;
        if (bVar4) {
          bVar9 = bVar5;
        }
        if (bVar7) {
          bVar9 = bVar5;
        }
        if (bVar4) {
          bVar16 = 0;
        }
        if (bVar7) {
          bVar16 = 0;
        }
        pbVar13[2] = bVar14;
        pbVar13[1] = bVar9;
        *pbVar13 = bVar16;
        pbVar13[3] = 0xff;
        pbVar13 = pbVar13 + (dest->super_fe_image).bytespp;
        pfVar17 = (float *)((long)pfVar17 + (long)(src->super_fe_image).bytespp);
      }
      pfVar17 = (float *)((long)pfVar11 + (long)(src->super_fe_image).pitch);
      pbVar13 = pbVar8 + (dest->super_fe_image).pitch;
      iVar12 = iVar12 + 1;
      iVar6 = iVar3;
      pfVar11 = pfVar17;
      pbVar8 = pbVar13;
    } while (iVar12 != iVar2);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }